

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O1

void andyzip::brotli_decoder::read_huffman_code<andyzip::huffman_table<258>>
               (brotli_decoder_state *s,huffman_table<258> *table,int alphabet_size)

{
  byte bVar1;
  ushort uVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  char cVar8;
  sbyte sVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint32_t uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  huffman_table<18> complex_table;
  uint16_t symbols [258];
  uint local_2e0;
  huffman_table<18> local_2a8;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined2 local_228;
  
  uVar18 = s->bitptr;
  pcVar3 = s->src;
  uVar11 = *(uint *)(pcVar3 + (uVar18 >> 3));
  uVar13 = uVar18 + 2;
  s->bitptr = uVar13;
  if (s->error == ok) {
    uVar5 = uVar11 >> ((byte)uVar18 & 7) & 3;
    uVar7 = (ulong)uVar5;
    uVar11 = alphabet_size & 0x3ff;
    if (uVar5 == 1) {
      uVar13 = *(uint *)(pcVar3 + (uVar13 >> 3)) >> ((byte)uVar13 & 7) & 3;
      s->bitptr = uVar18 + 4;
      iVar10 = 0;
      uVar11 = uVar11 - 1;
      if (uVar11 != 0) {
        do {
          iVar10 = iVar10 + 1;
          bVar4 = 1 < uVar11;
          uVar11 = (int)uVar11 >> 1;
        } while (bVar4);
      }
      uVar16 = s->bitptr;
      lVar17 = 0;
      do {
        uVar18 = *(uint *)(pcVar3 + (uVar16 >> 3));
        bVar1 = (byte)uVar16;
        uVar16 = uVar16 + iVar10;
        s->bitptr = uVar16;
        *(ushort *)((long)&local_238 + lVar17 * 2) =
             (ushort)(uVar18 >> (bVar1 & 7)) & ~(ushort)(-1 << ((byte)iVar10 & 0x1f));
        lVar17 = lVar17 + 1;
      } while ((ulong)uVar13 + 1 != lVar17);
      uVar18 = 0;
      if (uVar13 == 3) {
        uVar11 = s->bitptr;
        uVar18 = (uint)((*(uint *)(pcVar3 + (uVar11 >> 3)) >> (uVar11 & 7) & 1) != 0);
        s->bitptr = uVar11 + 1;
      }
      huffman_table<258>::init
                (table,(EVP_PKEY_CTX *)
                       (read_huffman_code<andyzip::huffman_table<258>_>::simple_lengths +
                       (uVar18 + uVar13)));
    }
    else {
      local_238 = 0;
      uStack_230 = 0;
      local_228 = 0;
      uVar13 = s->bitptr;
      iVar10 = 0;
      iVar14 = 0;
      do {
        uVar18 = *(uint *)(pcVar3 + (uVar13 >> 3)) >> ((byte)uVar13 & 7) & 0xf;
        uVar13 = "\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[uVar18] + uVar13
        ;
        s->bitptr = uVar13;
        bVar1 = ""[uVar18];
        *(byte *)((long)&local_238 + (ulong)"\x01\x02\x03\x04"[uVar7]) = bVar1;
        if ((0x1111U >> uVar18 & 1) == 0) {
          iVar14 = iVar14 + 1;
          iVar10 = iVar10 + (0x20U >> (bVar1 & 0x1f));
          cVar8 = (0x1f < iVar10) * '\x05';
        }
        else {
          cVar8 = '\0';
        }
        if (cVar8 != '\0') goto LAB_001048f8;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 0x12);
      cVar8 = '\x05';
LAB_001048f8:
      if (cVar8 == '\x05') {
        if (((iVar14 == 1) || (iVar10 == 0x20)) &&
           (huffman_table<18>::init(&local_2a8,(EVP_PKEY_CTX *)&local_238),
           local_2a8.invalid_ == false)) {
          uVar16 = s->bitptr;
          pcVar3 = s->src;
          local_2e0 = 8;
          iVar10 = 0;
          iVar14 = 0;
          iVar15 = 0;
          uVar13 = 0;
          do {
            if ((uVar11 - iVar15 == 0 || (int)uVar11 < iVar15) || (0x7fff < iVar10)) {
              if (iVar10 < 0x8001) {
                memset((void *)((long)&local_238 + (long)iVar15),0,(long)(int)(uVar11 - iVar15));
                huffman_table<258>::init(table,(EVP_PKEY_CTX *)&local_238);
                if (table->invalid_ != true) {
                  return;
                }
              }
              goto LAB_00104bc3;
            }
            uVar5 = *(uint *)(pcVar3 + (uVar16 >> 3)) >> ((byte)uVar16 & 7);
            iVar12 = (1 - (uint)local_2a8.min_length_) - uVar16;
            uVar18 = 0;
            do {
              uVar19 = uVar18;
              iVar12 = iVar12 + -1;
              uVar18 = uVar19 + 1;
            } while (local_2a8.limits_[uVar19] <
                     CONCAT11(rev16(unsigned_short)::BitReverseTable256[uVar5 & 0xff],
                              rev16(unsigned_short)::BitReverseTable256[uVar5 >> 8 & 0xff]));
            uVar2 = local_2a8.symbols_
                    [(uint)(ushort)(CONCAT11(rev16(unsigned_short)::BitReverseTable256[uVar5 & 0xff]
                                             ,rev16(unsigned_short)::BitReverseTable256
                                              [uVar5 >> 8 & 0xff]) >>
                                   (('\x11' - local_2a8.min_length_) - (char)(uVar19 + 1) & 0x1f)) -
                     (uint)local_2a8.base_[uVar19]];
            uVar16 = -iVar12;
            s->bitptr = uVar16;
            if (uVar2 < 0x10) {
              lVar17 = (long)iVar15;
              iVar15 = iVar15 + 1;
              *(byte *)((long)&local_238 + lVar17) = (byte)uVar2;
              uVar18 = 0x8000 >> ((byte)uVar2 & 0x1f);
              uVar5 = (uint)uVar2;
              if (uVar5 == 0) {
                uVar18 = 0;
                uVar5 = local_2e0;
              }
              iVar10 = iVar10 + uVar18;
              bVar4 = true;
              iVar14 = 0;
              uVar18 = uVar13;
              local_2e0 = uVar5;
            }
            else {
              uVar18 = 0;
              if (uVar2 == 0x10) {
                uVar18 = local_2e0;
              }
              uVar5 = uVar2 == 0x10 ^ 3;
              sVar9 = (sbyte)uVar5;
              uVar19 = ~(-1 << sVar9) & *(uint *)(pcVar3 + (uVar16 >> 3)) >> ((byte)uVar16 & 7);
              uVar16 = uVar5 - iVar12;
              s->bitptr = uVar16;
              iVar12 = iVar14;
              if (uVar13 != uVar18) {
                iVar12 = 0;
              }
              iVar20 = iVar12 + -2 << sVar9;
              if (iVar12 < 1) {
                iVar20 = iVar12;
              }
              iVar14 = uVar19 + iVar20 + 3;
              iVar6 = (iVar14 - iVar12) + iVar15;
              bVar4 = iVar6 <= (int)uVar11;
              if ((int)uVar11 < iVar6) {
                s->error = huffman_length_error;
              }
              else {
                if (iVar14 != iVar12) {
                  memset((void *)((long)&local_238 + (long)iVar15),uVar18,
                         (ulong)(((uVar19 + iVar20) - iVar12) + 2) + 1);
                  iVar6 = 0;
                  do {
                    iVar6 = iVar6 + -1;
                  } while (((iVar12 - iVar20) - uVar19) + -3 != iVar6);
                  iVar15 = iVar15 - iVar6;
                }
                iVar12 = (iVar14 - iVar12) * (0x8000U >> ((byte)uVar18 & 0x1f));
                if (uVar18 == 0) {
                  iVar12 = 0;
                }
                iVar10 = iVar12 + iVar10;
              }
            }
            uVar13 = uVar18;
          } while (bVar4);
        }
        else {
LAB_00104bc3:
          s->error = huffman_length_error;
        }
      }
    }
  }
  return;
}

Assistant:

static void read_huffman_code(brotli_decoder_state &s, Table &table, int alphabet_size) {
      int code_type = s.read(2);
      if (s.error != error_code::ok) return;
      alphabet_size &= 1023;
      if (debug) fprintf(s.log_file, "[ReadHuffmanCode] s->sub_loop_counter = %d\n", code_type);
      if (code_type == 1) {
        // 3.4.  Simple Prefix Codes
        int num_symbols = s.read(2) + 1;
        int alphabet_bits = log2_floor(alphabet_size - 1);
        uint16_t symbols[Table::max_codes];
        for (int i = 0; i != num_symbols; ++i) {
          symbols[i] = (uint16_t)s.read(alphabet_bits);
          if (debug) fprintf(s.log_file, "[ReadSimpleHuffmanSymbols] s->symbols_lists_array[i] = %d\n", symbols[i]);
        }
        if (debug) fprintf(s.log_file, "[ReadHuffmanCode] s->symbol = %d\n", num_symbols-1);
        static const uint8_t simple_lengths[][4] = {
          {0},
          {1, 1},
          {1, 2, 2},
          {2, 2, 2, 2},
          {1, 2, 3, 3},
        };
        int tree_select = num_symbols == 4 ? s.read(1) : 0;
        table.init(simple_lengths[num_symbols - 1 + tree_select], symbols, num_symbols);
      } else {
        // 3.5.  Complex Prefix Codes
        andyzip::huffman_table<18> complex_table;
        {
          uint8_t lengths[18] = {0};
          int space = 0;
          int num_codes = 0;
          for (int i = code_type; i != 18; ++i) {
            int bits = s.peek(4);
            if (s.error != error_code::ok) return;

            static const uint8_t kCodeLengthCodeOrder[18] = {
              1, 2, 3, 4, 0, 5, 17, 6, 16, 7, 8, 9, 10, 11, 12, 13, 14, 15,
            };

            // Static prefix code for the complex code length code lengths.
            static const uint8_t kCodeLengthPrefixLength[16] = {
              2, 2, 2, 3, 2, 2, 2, 4, 2, 2, 2, 3, 2, 2, 2, 4,
            };

            static const uint8_t kCodeLengthPrefixValue[16] = {
              0, 4, 3, 2, 0, 4, 3, 1, 0, 4, 3, 2, 0, 4, 3, 5,
            };

            s.drop(kCodeLengthPrefixLength[bits]);
            uint8_t length = kCodeLengthPrefixValue[bits];
            lengths[kCodeLengthCodeOrder[i]] = length;
            if (debug) fprintf(s.log_file, "[ReadCodeLengthCodeLengths] s->code_length_code_lengths[%d] = %d\n", kCodeLengthCodeOrder[i], lengths[kCodeLengthCodeOrder[i]]);
            if (length) {
              ++num_codes;
              space += 32 >> length;
              if (space >= 32) break;
            }
          }
          if (num_codes != 1 && space != 32) {
            if (debug) fprintf(s.log_file, "bad\n");
            s.error = error_code::huffman_length_error;
            return;
          }

          complex_table.init(lengths, nullptr, 18);
          if (complex_table.invalid()) {
            if (debug) fprintf(s.log_file, "bad2\n");
            s.error = error_code::huffman_length_error;
            return;
          }
        }

        {
          int space = 0;
          uint8_t lengths[Table::max_codes];
          uint8_t nzcl = 8;
          int prev_code_len = 8;
          int repeat = 0;
          int repeat_code_len = 0;
          int i = 0;
          for(; i < alphabet_size && space < 32768;) {
            auto code = complex_table.decode(s.peek(16));
            s.drop(code.first);
            int code_len = code.second;
            if (code_len < 16) {
              if (code_len) {
                if (debug) fprintf(s.log_file, "[ReadHuffmanCode] code_length[%d] = %d\n", i, code_len);
              }
              if (i + 1 > alphabet_size) {
                s.error = error_code::huffman_length_error;
                if (debug) fprintf(s.log_file, "bad3\n");
                return;
              }
              lengths[i++] = (uint8_t)code_len;
              if (code_len) {
                space += 32768 >> code_len;
                prev_code_len = code_len;
              }
              repeat = 0;
            } else {
              int extra_bits = code_len == 16 ? 2 : 3;
              int new_len = code_len == 16 ? prev_code_len : 0;
              int repeat_delta = s.peek(extra_bits);
              s.drop(extra_bits);

              if (repeat_code_len != new_len) {
                repeat = 0;
                repeat_code_len = new_len;
              }

              int old_repeat = repeat;
              if (repeat > 0) {
                repeat -= 2;
                repeat <<= extra_bits;
              }

              repeat += repeat_delta + 3;
              repeat_delta = repeat - old_repeat;

              if (debug) fprintf(s.log_file, "[ReadHuffmanCode] code_length[%d..%d] = %d\n", i, i + repeat_delta - 1, new_len);
              if (i + repeat_delta > alphabet_size) {
                if (debug) fprintf(s.log_file, "bad4 %d %d %d\n", i, repeat_delta, alphabet_size);
                s.error = error_code::huffman_length_error;
                return;
              }
              for (int j = 0; j != repeat_delta; ++j) {
                lengths[i++] = new_len;
              }
              if (new_len) {
                space += (32768 >> new_len) * repeat_delta;
              }
            }
          }
          if (space > 32768) {
            if (debug) fprintf(s.log_file, "bad5\n");
            s.error = error_code::huffman_length_error;
            return;
          }
          memset(lengths + i, 0, alphabet_size - i);
          table.init(lengths, nullptr, alphabet_size);
          if (table.invalid()) {
            if (debug) fprintf(s.log_file, "bad6\n");
            s.error = error_code::huffman_length_error;
            return;
          }
        }
      }
    }